

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O3

int FIX::DateTime::convertToNanos(int fraction,int precision)

{
  switch(precision) {
  case 0:
    fraction = fraction * 1000000000;
    break;
  case 1:
    return fraction * 100000000;
  case 2:
    return fraction * 10000000;
  case 3:
    return fraction * 1000000;
  case 4:
    return fraction * 100000;
  case 5:
    return fraction * 10000;
  case 6:
    return fraction * 1000;
  case 7:
    return fraction * 100;
  case 8:
    return fraction * 10;
  }
  return fraction;
}

Assistant:

static int convertToNanos(int fraction, int precision) {
    int nanos;

    switch (precision) {
    case 0:
      nanos = fraction * PRECISION_FACTOR[0];
      break;

    case 1:
      nanos = fraction * PRECISION_FACTOR[1];
      break;

    case 2:
      nanos = fraction * PRECISION_FACTOR[2];
      break;

    case 3:
      nanos = fraction * PRECISION_FACTOR[3];
      break;

    case 4:
      nanos = fraction * PRECISION_FACTOR[4];
      break;

    case 5:
      nanos = fraction * PRECISION_FACTOR[5];
      break;

    case 6:
      nanos = fraction * PRECISION_FACTOR[6];
      break;

    case 7:
      nanos = fraction * PRECISION_FACTOR[7];
      break;

    case 8:
      nanos = fraction * PRECISION_FACTOR[8];
      break;

    case 9:
    default:
      nanos = fraction * PRECISION_FACTOR[9];
      break;
    }

    return nanos;
  }